

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall
TCPSocket::TCPSocketError::TCPSocketError(TCPSocketError *this,string *reason,int errorCode)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  *(undefined ***)this = &PTR__TCPSocketError_001c37e0;
  std::operator+(&local_58,reason," (");
  std::__cxx11::to_string(&sStack_78,this->code);
  std::operator+(&local_38,&local_58,&sStack_78);
  std::operator+(&this->reason,&local_38,")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  this->code = errorCode;
  return;
}

Assistant:

TCPSocketError(std::string reason, int errorCode = 0) : reason(reason + " (" + std::to_string(code) + ")"), code(errorCode){}